

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase747::run(TestCase747 *this)

{
  PointerBuilder builder_00;
  ArrayPtr<const_bool> value;
  Builder root;
  Reader reader;
  Runnable local_278;
  Reader *local_270;
  Maybe<kj::Exception> e;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  e.ptr._0_8_ = root._builder.segment;
  e.ptr.field_1.value.ownFile.content.ptr = (char *)root._builder.capTable;
  e.ptr.field_1.value.ownFile.content.size_ = (size_t)root._builder.pointers;
  reader._reader.segment = (SegmentReader *)CONCAT44(reader._reader.segment._4_4_,0x1010001);
  builder_00.capTable = root._builder.capTable;
  builder_00.segment = root._builder.segment;
  builder_00.pointer = root._builder.pointers;
  value.size_ = 4;
  value.ptr = (bool *)&reader;
  PointerHelpers<capnp::List<bool,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value);
  reader._reader.segment = (SegmentReader *)&PTR_run_00391820;
  reader._reader.capTable = (CapTableReader *)&root;
  kj::_::runCatchingExceptions(&e,(Runnable *)&reader);
  if ((e.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2fb,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&e.ptr);
  StructBuilder::asReader(&root._builder);
  local_278._vptr_Runnable = (_func_int **)&PTR_run_00391850;
  local_270 = &reader;
  kj::_::runCatchingExceptions(&e,&local_278);
  if ((e.ptr.isSet == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x308,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&e.ptr);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, BitListUpgrade) {
  // No longer supported!

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<bool>>({true, false, true, true});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  auto reader = root.asReader();

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }
}